

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O0

void helicsFilterSet(HelicsFilter filt,char *prop,double val,HelicsError *err)

{
  Filter *pFVar1;
  HelicsError *in_RDX;
  long in_RSI;
  undefined8 in_XMM0_Qa;
  Filter *filter;
  HelicsError *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc0;
  undefined8 local_38;
  undefined8 local_30;
  
  pFVar1 = anon_unknown.dwarf_88686::getFilter(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (pFVar1 != (Filter *)0x0) {
    if (in_RSI == 0) {
      assignError(in_RDX,-4,"The supplied string argument is null and therefore invalid");
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      (*(pFVar1->super_Interface)._vptr_Interface[5])(in_XMM0_Qa,pFVar1,local_38,local_30);
    }
  }
  return;
}

Assistant:

void helicsFilterSet(HelicsFilter filt, const char* prop, double val, HelicsError* err)
{
    auto* filter = getFilter(filt, err);
    if (filter == nullptr) {
        return;
    }
    CHECK_NULL_STRING(prop, void());
    try {
        filter->set(prop, val);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}